

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O2

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *this,string *name,cmake *cm)

{
  bool bVar1;
  cmGlobalGhsMultiGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cmGlobalGhsMultiGenerator::GetActualName_abi_cxx11_();
  bVar1 = std::operator!=(name,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    this_00 = (cmGlobalGhsMultiGenerator *)0x0;
  }
  else {
    this_00 = (cmGlobalGhsMultiGenerator *)operator_new(0x640);
    cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(this_00,cm);
  }
  return &this_00->super_cmGlobalGenerator;
}

Assistant:

cmGlobalGenerator* CreateGlobalGenerator(const std::string& name,
                                           cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return nullptr;
    }
    return new T(cm);
  }